

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O2

double cholmod(double *A,int N,double *L,double eps,double maxinp)

{
  double *array;
  long lVar1;
  double *pdVar2;
  int iVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  lVar9 = (long)N;
  array = (double *)malloc(lVar9 * lVar9 * 8);
  if (eps < 0.0) {
    dVar13 = sqrt(eps);
  }
  else {
    dVar13 = SQRT(eps);
  }
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  iVar3 = 0;
  uVar10 = 0;
  if (0 < N) {
    uVar10 = (ulong)(uint)N;
  }
  for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
    array[uVar5] = A[iVar3];
    iVar3 = iVar3 + N + 1;
  }
  for (uVar5 = 0; (uint)(N * N) != uVar5; uVar5 = uVar5 + 1) {
    L[uVar5] = 0.0;
  }
  dVar14 = array_max_abs(array,N);
  dVar19 = maxinp;
  if ((maxinp == 0.0) && (!NAN(maxinp))) {
    if (dVar14 < 0.0) {
      dVar19 = sqrt(dVar14);
    }
    else {
      dVar19 = SQRT(dVar14);
    }
  }
  if (eps < 0.0) {
    dVar14 = sqrt(eps);
  }
  else {
    dVar14 = SQRT(eps);
  }
  iVar3 = 1;
  uVar5 = 0;
  pdVar4 = L;
  pdVar7 = L;
  dVar20 = 0.0;
  while (uVar5 != uVar10) {
    lVar11 = (long)iVar3;
    lVar1 = lVar9 * 8 * lVar11;
    pdVar12 = (double *)((long)pdVar4 + lVar1);
    pdVar2 = (double *)(lVar1 + (long)L);
    dVar15 = 0.0;
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      dVar15 = dVar15 + pdVar7[uVar8] * pdVar7[uVar8];
    }
    lVar6 = (long)((int)uVar5 * N) + uVar5;
    L[lVar6] = A[lVar6] - dVar15;
    dVar15 = 0.0;
    for (lVar1 = lVar11; lVar1 < lVar9; lVar1 = lVar1 + 1) {
      dVar16 = 0.0;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        dVar16 = dVar16 + pdVar7[uVar8] * pdVar2[uVar8];
      }
      dVar18 = A[uVar5 * lVar9 + lVar1];
      L[uVar5 + lVar1 * lVar9] = dVar18 - dVar16;
      dVar16 = ABS(dVar18 - dVar16);
      if (dVar16 <= dVar15) {
        dVar16 = dVar15;
      }
      pdVar2 = pdVar2 + lVar9;
      dVar15 = dVar16;
    }
    dVar16 = dVar15 / dVar19;
    if (dVar15 / dVar19 <= dVar13 * maxinp) {
      dVar16 = dVar13 * maxinp;
    }
    dVar15 = L[lVar6];
    dVar18 = dVar20;
    if (dVar15 <= dVar16 * dVar16) {
      dVar17 = dVar14 * dVar19;
      if (dVar14 * dVar19 <= dVar16) {
        dVar17 = dVar16;
      }
      dVar18 = dVar17 * dVar17 - dVar15;
      if (dVar18 <= dVar20) {
        dVar18 = dVar20;
      }
    }
    else if (dVar15 < 0.0) {
      dVar17 = sqrt(dVar15);
    }
    else {
      dVar17 = SQRT(dVar15);
    }
    uVar5 = uVar5 + 1;
    L[lVar6] = dVar17;
    for (; lVar11 < lVar9; lVar11 = lVar11 + 1) {
      *pdVar12 = *pdVar12 / L[lVar6];
      pdVar12 = pdVar12 + lVar9;
    }
    iVar3 = iVar3 + 1;
    pdVar7 = pdVar7 + lVar9;
    pdVar4 = pdVar4 + 1;
    dVar20 = dVar18;
  }
  free(array);
  return dVar20;
}

Assistant:

double cholmod(double *A, int N, double *L, double eps,double maxinp) {
	/*
	 * Algorithm 5.5.2 Dennis, Schnabel, Numerical Methods for Unconstrained Optimization and 
	 * Non-Linear Equations
	 */ 
	int i,j,k,step,step2;
	double ls;
	double *U22;
	double maxadd,maxdiag,minl,minl2,minljj;
	
	U22 = (double*) malloc(sizeof(double) * N * N);
	
	minl = sqrt(sqrt(eps)) * maxinp;
	maxadd = 0.0;
	
	for(i = 0; i < N;++i) {
		U22[i] = A[i+i*N];
	}
	
	for(i = 0; i < N * N;++i) {
		L[i] = 0.0;
	}
	
	maxdiag = array_max_abs(U22,N);
	
	if ( maxinp == 0.0) {
		maxinp = sqrt(maxdiag);
	}
	
	minl2 = sqrt(eps) * maxinp;
	
	for(j = 0; j < N;++j) {
		step = j * N;
		ls = 0.0;
		for(i = 0; i < j;++i) {
			ls += L[step+i] * L[step+i];
		}
		
		L[step+j] = A[step+j] - ls;
		minljj = 0.0;
		for(i = j+1; i < N;++i) {
			ls = 0.0;
			step2 = i * N;
			for(k = 0;k < j;++k) {
				ls += L[step+k] * L[step2+k];
			}
			L[step2+j] = A[step+i] - ls;
			
			if (fabs(L[step2+j]) > minljj) {
				minljj = fabs(L[step2+j]);
			}
		}
		
		if (minljj/maxinp > minl) {
			minljj = minljj/maxinp;
		} else {
			minljj = minl;
		}
		
		if (L[step+j] > minljj*minljj) {
				L[step+j] = sqrt(L[step+j]);
		} else {
			if (minljj < minl2) {
				minljj = minl2;
			}
			
			if (maxadd < (minljj*minljj - L[step+j])) {
				maxadd = minljj*minljj - L[step+j];
			}
			
			L[step+j] = minljj;
		}
		
		for(i = j+1; i < N;++i) {
			L[i*N+j] /= L[step+j];
		}
		
		
	}
	
	free(U22);
	
	return maxadd;
}